

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::isTimeLimitReached
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool forceCheck)

{
  type_conflict5 tVar1;
  byte in_SIL;
  time_t *__timer;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  double extraout_XMM0_Qa;
  Real RVar2;
  Real avgtimeinterval;
  int nClckSkips;
  Real currtime;
  double *in_stack_ffffffffffffff48;
  double dVar3;
  Real *val;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff60;
  int local_94;
  time_t local_84 [10];
  byte local_31;
  undefined8 local_20;
  undefined8 local_18;
  time_t *local_10;
  undefined8 local_8;
  
  local_31 = in_SIL & 1;
  in_RDI->nCallsToTimelim = in_RDI->nCallsToTimelim + 1;
  val = &in_RDI->maxTime;
  local_18 = infinity();
  local_10 = local_84;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffff60,(double)val,in_RDI);
  __timer = local_84;
  tVar1 = boost::multiprecision::operator>=
                    (in_stack_ffffffffffffff48,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x51b707);
  if (!tVar1) {
    if ((((local_31 & 1) == 0) && (199 < in_RDI->nCallsToTimelim)) && (0 < in_RDI->nClckSkipsLeft))
    {
      in_RDI->nClckSkipsLeft = in_RDI->nClckSkipsLeft + -1;
    }
    else {
      time(in_RDI,__timer);
      if (in_RDI->maxTime <= extraout_XMM0_Qa) {
        return true;
      }
      local_94 = 0x20;
      dVar3 = extraout_XMM0_Qa;
      RVar2 = cumulativeTime(in_RDI);
      if (((in_RDI->maxTime - extraout_XMM0_Qa) * 0.01) /
          ((dVar3 + RVar2) / (double)in_RDI->nCallsToTimelim + 1e-06) < 32.0) {
        local_94 = 0;
      }
      in_RDI->nClckSkipsLeft = local_94;
    }
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::isTimeLimitReached(const bool forceCheck)
   {
      // always update the number of calls, since the user might set a time limit later in the solving process
      ++nCallsToTimelim;

      // check if a time limit is actually set
      if(maxTime >= R(infinity))
         return false;

      // check if the expensive system call to update the time should be skipped again
      if(forceCheck || nCallsToTimelim < SOPLEX_NINITCALLS ||  nClckSkipsLeft <= 0)
      {
         Real currtime = time();

         if(currtime >= maxTime)
            return true;

         // determine the number of times the clock can be skipped again.
         int nClckSkips = SOPLEX_MAXNCLCKSKIPS;
         Real avgtimeinterval = (currtime + cumulativeTime()) / (Real)(nCallsToTimelim);

         // it would not be safe to skip the clock so many times since we are approaching the time limit
         if(SOPLEX_SAFETYFACTOR * (maxTime - currtime) / (avgtimeinterval + 1e-6) < nClckSkips)
            nClckSkips = 0;

         nClckSkipsLeft = nClckSkips;
      }
      else
         --nClckSkipsLeft;

      return false;
   }